

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O0

VirtualIterator<Kernel::TypedTermList>
Kernel::EqHelper::getRewritableVarsIterator
          (DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *unstableVars,Literal *lit,
          Ordering *ord)

{
  bool bVar1;
  Result RVar2;
  TermList *pTVar3;
  Term *in_RDX;
  IteratorCore<Kernel::TypedTermList> *in_RDI;
  TermList sel;
  RewritableVarsIt *in_stack_fffffffffffffc80;
  RewritableVarsIt *this;
  Literal *in_stack_fffffffffffffca0;
  Ordering *in_stack_fffffffffffffca8;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::TypedTermList>_>_>
  *in_stack_fffffffffffffce8;
  RewritableVarsIt *in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffd3f;
  Term *in_stack_fffffffffffffd40;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *in_stack_fffffffffffffd48;
  RewritableVarsIt *in_stack_fffffffffffffd50;
  IterTraits<Kernel::RewritableVarsIt> *in_stack_fffffffffffffd78;
  TermList local_28 [2];
  Term *local_18;
  
  local_18 = in_RDX;
  TermList::TermList(local_28);
  RVar2 = Ordering::getEqualityArgumentOrder(in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
  switch(RVar2) {
  case GREATER:
  case EQUAL:
    pTVar3 = Term::nthArgument(local_18,0);
    local_28[0]._content = pTVar3->_content;
    break;
  case LESS:
    pTVar3 = Term::nthArgument(local_18,1);
    local_28[0]._content = pTVar3->_content;
    break;
  case INCOMPARABLE:
    RewritableVarsIt::RewritableVarsIt
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
               (bool)in_stack_fffffffffffffd3f);
    Lib::iterTraits<Kernel::RewritableVarsIt>(in_stack_fffffffffffffcf8);
    Lib::IterTraits<Kernel::RewritableVarsIt>::unique(in_stack_fffffffffffffd78);
    Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::persistent((IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
                  *)in_stack_fffffffffffffcf8);
    Lib::
    pvi<Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::TypedTermList>,unsigned_long>(Lib::Stack<Kernel::TypedTermList>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::TypedTermList>>>>
              (in_stack_fffffffffffffce8);
    Lib::
    IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::TypedTermList>_>_>
    ::~IterTraits((IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::TypedTermList>_>_>
                   *)0x84bf14);
    Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::~IterTraits((IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
                   *)0x84bf21);
    Lib::IterTraits<Kernel::RewritableVarsIt>::~IterTraits
              ((IterTraits<Kernel::RewritableVarsIt> *)0x84bf2e);
    RewritableVarsIt::~RewritableVarsIt(in_stack_fffffffffffffc80);
    return (VirtualIterator<Kernel::TypedTermList>)in_RDI;
  }
  bVar1 = TermList::isTerm((TermList *)0x84c015);
  if (bVar1) {
    TermList::term((TermList *)0x84c041);
    this = (RewritableVarsIt *)&stack0xfffffffffffffca8;
    RewritableVarsIt::RewritableVarsIt
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
               (bool)in_stack_fffffffffffffd3f);
    Lib::iterTraits<Kernel::RewritableVarsIt>(in_stack_fffffffffffffcf8);
    Lib::IterTraits<Kernel::RewritableVarsIt>::unique(in_stack_fffffffffffffd78);
    Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::persistent((IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
                  *)in_stack_fffffffffffffcf8);
    Lib::
    pvi<Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::TypedTermList>,unsigned_long>(Lib::Stack<Kernel::TypedTermList>&&,unsigned_long)::_lambda(auto:1)_1_,Kernel::TypedTermList>>>>
              (in_stack_fffffffffffffce8);
    Lib::
    IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1781:65),_Kernel::TypedTermList>_>_>
    ::~IterTraits((IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1781:65),_Kernel::TypedTermList>_>_>
                   *)0x84c0bf);
    Lib::
    IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1594:20)>_>_>
    ::~IterTraits((IterTraits<Lib::IterTraits<Lib::FilterMapIter<Kernel::RewritableVarsIt,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1594:20)>_>_>
                   *)0x84c0cc);
    Lib::IterTraits<Kernel::RewritableVarsIt>::~IterTraits
              ((IterTraits<Kernel::RewritableVarsIt> *)0x84c0d9);
    RewritableVarsIt::~RewritableVarsIt(this);
  }
  else {
    Lib::VirtualIterator<Kernel::TypedTermList>::getEmpty();
  }
  return (VirtualIterator<Kernel::TypedTermList>)in_RDI;
}

Assistant:

VirtualIterator<TypedTermList> EqHelper::getRewritableVarsIterator(DHSet<unsigned>* unstableVars, Literal* lit, const Ordering& ord)
{
  ASS(lit->isEquality());
    
  TermList sel;
  switch(ord.getEqualityArgumentOrder(lit)) {
  case Ordering::INCOMPARABLE: {
    return pvi(iterTraits(RewritableVarsIt(unstableVars, lit))
      .unique()
      .persistent());
  }
  case Ordering::EQUAL:
  case Ordering::GREATER:
    sel=*lit->nthArgument(0);
    break;
  case Ordering::LESS:
    sel=*lit->nthArgument(1);
    break;
#if VDEBUG
  default:
    ASSERTION_VIOLATION;
#endif
  }
  if (!sel.isTerm()) {
    return VirtualIterator<TypedTermList>::getEmpty();
  }
  return pvi(iterTraits(RewritableVarsIt(unstableVars, sel.term(), true)).unique().persistent());
}